

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

void slang::ast::Lookup::unqualifiedImpl
               (Scope *scope,string_view name,LookupLocation location,
               optional<slang::SourceRange> sourceRange,bitmask<slang::ast::LookupFlags> flags,
               SymbolIndex outOfBlockIndex,LookupResult *result,Scope *originalScope,
               SyntaxNode *originalSyntax)

{
  size_t *psVar1;
  char *pcVar2;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  undefined4 uVar5;
  pointer ppWVar6;
  WildcardImportSymbol *this;
  int *piVar7;
  SourceManager *this_00;
  group_type_pointer pgVar8;
  value_type_pointer ppVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  optional<slang::SourceRange> sourceRange_00;
  string_view lookupName;
  string_view arg;
  string_view name_00;
  string_view arg_00;
  size_t sVar12;
  char *pcVar13;
  undefined8 uVar14;
  LookupResult *pLVar15;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  optional<bool> oVar19;
  int iVar20;
  uint uVar21;
  SymbolKind SVar22;
  uint64_t uVar23;
  PackageSymbol *this_01;
  ulong uVar24;
  void *__dest;
  Diagnostic *pDVar25;
  Type *pTVar26;
  Type *pTVar27;
  SourceLocation SVar28;
  SubroutineSymbol *pSVar29;
  DeclaredType *pDVar30;
  Symbol *pSVar31;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *p;
  WildcardImportData *pWVar32;
  size_type __rlen;
  SymbolIndex outOfBlockIndex_00;
  ulong uVar33;
  Info *pIVar34;
  SubroutineSymbol *pSVar35;
  Scope *pSVar36;
  ulong uVar37;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *__n;
  long lVar38;
  ulong uVar39;
  SubroutineSymbol *sub;
  pointer ppWVar40;
  Scope *pSVar41;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar42;
  long lVar43;
  SymbolIndex SVar44;
  basic_string_view<char,_std::char_traits<char>_> *k;
  Info *pIVar45;
  string_view *sv;
  uchar uVar46;
  uchar uVar50;
  uchar uVar51;
  byte bVar52;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar53;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar56;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar57;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar58;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar59;
  uchar uVar60;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar61;
  uchar uVar62;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar63;
  uchar uVar64;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar65;
  byte bVar66;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar67;
  uchar uVar68;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar69;
  uchar uVar70;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar71;
  uchar uVar72;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar73;
  byte bVar74;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar75;
  uchar uVar76;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar77;
  uchar uVar78;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar79;
  uchar uVar80;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar81;
  byte bVar82;
  pair<const_slang::ast::ClassType_*,_bool> pVar83;
  LookupLocation location_00;
  size_t pos;
  Symbol *imported;
  size_t pos_1;
  locator res;
  anon_class_32_4_2e62d3a1 reportRecursiveError;
  SmallVector<Import,_4UL> imports;
  SmallSet<const_slang::ast::Symbol_*,_2UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
  importDedup;
  try_emplace_args_t local_1d1;
  WildcardImportData *local_1d0;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_1c8;
  Scope *local_1c0;
  SubroutineSymbol *local_1b8;
  ulong local_1b0;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_1a8;
  Symbol *local_1a0;
  string_view local_198;
  undefined1 local_188 [16];
  undefined8 local_178;
  uchar uStack_170;
  uchar uStack_16f;
  uchar uStack_16e;
  byte bStack_16d;
  uchar uStack_16c;
  uchar uStack_16b;
  uchar uStack_16a;
  byte bStack_169;
  locator local_168;
  anon_class_32_4_2e62d3a1 local_150;
  Token local_130;
  Info *local_120;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> local_118 [64];
  group15<boost::unordered::detail::foa::plain_integral> local_d8;
  group15<boost::unordered::detail::foa::plain_integral> *local_c8;
  group15<boost::unordered::detail::foa::plain_integral> *local_c0;
  undefined1 local_b8 [24];
  value_type_pointer ppSStack_a0;
  undefined1 local_98 [16];
  long local_88;
  ulong local_80;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> local_58;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_57;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_56;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_55;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_54;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_53;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_52;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_51;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_50;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_4f;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_4e;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_4d;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_4c;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_4b;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_4a;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  local_198._M_str = name._M_str;
  local_198._M_len = name._M_len;
  local_1b0 = CONCAT44(local_1b0._4_4_,flags.m_bits);
  local_178 = CONCAT44(local_178._4_4_,location.index);
  local_150.sourceRange = &sourceRange;
  local_150.name = &local_198;
  local_150.result = result;
  local_150.scope = scope;
  if (scope->deferredMemberIndex != Invalid) {
    Scope::elaborate(scope);
  }
  phVar42 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)scope->nameMap;
  local_1c0 = scope;
  uVar23 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     (phVar42,&local_198);
  pcVar13 = local_198._M_str;
  sVar12 = local_198._M_len;
  pWVar32 = (WildcardImportData *)(uVar23 >> ((byte)*phVar42 & 0x3f));
  local_88 = *(long *)(phVar42 + 0x10);
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar23 & 0xff];
  auVar54._4_4_ = uVar5;
  auVar54._0_4_ = uVar5;
  auVar54._8_4_ = uVar5;
  auVar54._12_4_ = uVar5;
  local_80 = (ulong)((uint)uVar23 & 7);
  local_1b8 = (SubroutineSymbol *)0x0;
  uVar33 = 0;
  local_1c8 = phVar42;
  while( true ) {
    pcVar2 = (char *)(local_88 + (long)pWVar32 * 0x10);
    local_48 = *pcVar2;
    cStack_47 = pcVar2[1];
    cStack_46 = pcVar2[2];
    cStack_45 = pcVar2[3];
    cStack_44 = pcVar2[4];
    cStack_43 = pcVar2[5];
    cStack_42 = pcVar2[6];
    cStack_41 = pcVar2[7];
    cStack_40 = pcVar2[8];
    cStack_3f = pcVar2[9];
    cStack_3e = pcVar2[10];
    cStack_3d = pcVar2[0xb];
    cStack_3c = pcVar2[0xc];
    cStack_3b = pcVar2[0xd];
    cStack_3a = pcVar2[0xe];
    cStack_39 = pcVar2[0xf];
    auVar47[0] = -(local_48 == auVar54[0]);
    auVar47[1] = -(cStack_47 == auVar54[1]);
    auVar47[2] = -(cStack_46 == auVar54[2]);
    auVar47[3] = -(cStack_45 == auVar54[3]);
    auVar47[4] = -(cStack_44 == auVar54[4]);
    auVar47[5] = -(cStack_43 == auVar54[5]);
    auVar47[6] = -(cStack_42 == auVar54[6]);
    auVar47[7] = -(cStack_41 == auVar54[7]);
    auVar47[8] = -(cStack_40 == auVar54[8]);
    auVar47[9] = -(cStack_3f == auVar54[9]);
    auVar47[10] = -(cStack_3e == auVar54[10]);
    auVar47[0xb] = -(cStack_3d == auVar54[0xb]);
    auVar47[0xc] = -(cStack_3c == auVar54[0xc]);
    auVar47[0xd] = -(cStack_3b == auVar54[0xd]);
    auVar47[0xe] = -(cStack_3a == auVar54[0xe]);
    auVar47[0xf] = -(cStack_39 == auVar54[0xf]);
    local_1a8 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                CONCAT71(local_1a8._1_7_,cStack_39);
    uVar21 = (uint)(ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe);
    local_1d0 = pWVar32;
    if (uVar21 != 0) break;
LAB_003a93f6:
    pSVar36 = local_1c0;
    pSVar35 = local_1b8;
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[local_80] & (byte)local_1a8) == 0)
    goto LAB_003a9446;
    lVar38 = uVar33 + 1;
    uVar33 = uVar33 + 1;
    pWVar32 = (WildcardImportData *)
              ((long)&(local_1d0->wildcardImports).
                      super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar38 & *(ulong *)(local_1c8 + 8)
              );
    if (*(ulong *)(local_1c8 + 8) < uVar33) goto LAB_003a9446;
  }
  lVar38 = *(long *)(local_1c8 + 0x18) + (long)pWVar32 * 0x168;
  local_188 = auVar54;
  while( true ) {
    uVar10 = 0;
    if (uVar21 != 0) {
      for (; (uVar21 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
      }
    }
    uVar24 = (ulong)uVar10;
    if ((sVar12 == *(size_t *)(lVar38 + uVar24 * 0x18)) &&
       ((sVar12 == 0 ||
        (iVar20 = bcmp(pcVar13,*(void **)(lVar38 + 8 + uVar24 * 0x18),sVar12), auVar54 = local_188,
        iVar20 == 0)))) break;
    uVar21 = uVar21 - 1 & uVar21;
    if (uVar21 == 0) goto LAB_003a93f6;
  }
  pSVar36 = local_1c0;
  pSVar35 = *(SubroutineSymbol **)(uVar24 * 0x18 + lVar38 + 0x10);
  SVar22 = (pSVar35->super_Symbol).kind;
  if ((pSVar35->super_Symbol).indexInScope < (SymbolIndex)local_178) {
    bVar17 = true;
    if ((originalSyntax != (SyntaxNode *)0x0) && (SVar22 == TransparentMember)) {
      piVar7 = (int *)(pSVar35->super_Scope).compilation;
      bVar17 = true;
      if (*piVar7 != 0xb) goto LAB_003a9de1;
      pTVar27 = *(Type **)(*(long *)(*(long *)(*(long *)(piVar7 + 8) + 8) + 0x20) + 8);
      if ((pTVar27->super_Symbol).kind == ClassType) {
        pVar83 = getContainingClass(local_1c0);
        if (pVar83.first == (ClassType *)0x0) goto LAB_003a9bef;
        bVar16 = Type::isDerivedFrom(&(pVar83.first)->super_Type,pTVar27);
      }
      else {
LAB_003a9bef:
        bVar16 = false;
      }
      this_00 = pSVar36->compilation->sourceManager;
      if (this_00 != (SourceManager *)0x0 && bVar16 == false) {
        local_130 = slang::syntax::SyntaxNode::getFirstToken(originalSyntax);
        SVar28 = parsing::Token::location(&local_130);
        oVar19 = SourceManager::isBeforeInCompilationUnit
                           (this_00,*(SourceLocation *)(piVar7 + 6),SVar28);
        if (((ushort)oVar19.super__Optional_base<bool,_true,_true>._M_payload.
                     super__Optional_payload_base<bool> & 1) == 0 &&
            ((ushort)oVar19.super__Optional_base<bool,_true,_true>._M_payload.
                     super__Optional_payload_base<bool> >> 8 & 1) != 0) goto LAB_003a9dce;
      }
      goto LAB_003a9de1;
    }
  }
  else {
    bVar17 = true;
    if ((int)SVar22 < 0x43) {
      if ((int)SVar22 < 0x23) {
        if (SVar22 != EnumValue) {
          if (SVar22 != ClassType) goto LAB_003a9dce;
          lVar38 = 0xa8;
          goto LAB_003a9db4;
        }
      }
      else {
        if (SVar22 == TypeAlias) {
          lVar38 = 0x90;
LAB_003a9db4:
          lVar38 = *(long *)((long)&(pSVar35->super_Symbol).kind + lVar38);
          if ((lVar38 == 0) ||
             (SVar44 = *(SymbolIndex *)(lVar38 + 0x30),
             (result->flags).m_bits = (result->flags).m_bits | 0x10,
             (SymbolIndex)local_178 <= SVar44)) goto LAB_003a9dce;
          goto LAB_003a9de1;
        }
        if (SVar22 != Parameter) {
          if (SVar22 == Subroutine) {
            if (((pSVar35->declaredReturnType).field_0x3f & 0x40) != 0) goto LAB_003a9fd1;
            pTVar26 = DeclaredType::getType(&pSVar35->declaredReturnType);
            pTVar27 = pTVar26->canonical;
            if (pTVar27 == (Type *)0x0) {
              Type::resolveCanonical(pTVar26);
              pTVar27 = pTVar26->canonical;
            }
            if ((pTVar27->super_Symbol).kind != VoidType) {
              bVar52 = *(undefined1 *)((long)&(pSVar35->flags).m_bits + 1);
              goto joined_r0x003a9fc6;
            }
            goto LAB_003a9de1;
          }
          goto LAB_003a9dce;
        }
      }
LAB_003a9bd1:
      local_1b0 = local_1b0 & 0xffffffff00007ffd;
    }
    else {
      if ((int)SVar22 < 0x4f) {
        if (SVar22 == GenericClassDef) {
          lVar38 = 0x2d0;
          goto LAB_003a9db4;
        }
        if (SVar22 != MethodPrototype) {
          if (SVar22 == Specparam) goto LAB_003a9bd1;
          goto LAB_003a9dce;
        }
        if (((pSVar35->declaredReturnType).field_0x3f & 0x40) != 0) {
LAB_003a9fd1:
          unqualifiedImpl::anon_class_32_4_2e62d3a1::operator()(&local_150,&pSVar35->super_Symbol);
          return;
        }
        pTVar26 = DeclaredType::getType(&pSVar35->declaredReturnType);
        pTVar27 = pTVar26->canonical;
        if (pTVar27 == (Type *)0x0) {
          Type::resolveCanonical(pTVar26);
          pTVar27 = pTVar26->canonical;
        }
        if ((pTVar27->super_Symbol).kind != VoidType) {
          bVar52 = *(byte *)((long)&pSVar35->visibility + 1);
joined_r0x003a9fc6:
          if ((bVar52 & 2) == 0) goto LAB_003a9dce;
        }
        goto LAB_003a9de1;
      }
      if (SVar22 - Sequence < 2) goto LAB_003a9de1;
    }
LAB_003a9dce:
    if ((local_1b0 & 2) == 0) goto LAB_003a9446;
    bVar17 = false;
LAB_003a9de1:
    SVar22 = (pSVar35->super_Symbol).kind;
  }
  if (SVar22 != TransparentMember) goto LAB_003a9e7a;
  do {
    pSVar35 = (SubroutineSymbol *)(pSVar35->super_Scope).compilation;
    SVar22 = (pSVar35->super_Symbol).kind;
  } while (SVar22 == TransparentMember);
  pSVar41 = originalScope;
  if (((pSVar35->super_Symbol).parentScope)->thisSym->kind != 0x62) goto LAB_003a9e7a;
  do {
    pSVar31 = pSVar41->thisSym;
    if (pSVar31->kind == InstanceBody) {
      if (*(int *)(pSVar31[2].name._M_str + 0x48) != 2) break;
      goto LAB_003a9e7a;
    }
    if (pSVar31->kind == AnonymousProgram) goto LAB_003a9e7a;
    pSVar41 = pSVar31->parentScope;
  } while (pSVar31->parentScope != (Scope *)0x0);
  if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
    range_00.endLoc =
         sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
    range_00.startLoc =
         sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
    pDVar25 = Diagnostics::add(&result->diagnostics,pSVar36->thisSym,(DiagCode)0xf000a,range_00);
    Diagnostic::addNote(pDVar25,(DiagCode)0x50001,(pSVar35->super_Symbol).location);
    SVar22 = (pSVar35->super_Symbol).kind;
  }
LAB_003a9e7a:
  if ((int)SVar22 < 0x33) {
    if (SVar22 == ForwardingTypedef) {
LAB_003a9ebc:
      pSVar29 = (SubroutineSymbol *)result->found;
      goto LAB_003a9eda;
    }
    if (SVar22 == ModportClocking) {
      pSVar29 = (SubroutineSymbol *)(pSVar35->super_Scope).compilation;
      result->found = (Symbol *)pSVar29;
      goto LAB_003a9eda;
    }
LAB_003a9ec2:
    result->found = &pSVar35->super_Symbol;
    pSVar29 = pSVar35;
  }
  else {
    if (SVar22 != MethodPrototype) {
      if (SVar22 != ExplicitImport) goto LAB_003a9ec2;
      pSVar31 = ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)pSVar35);
      result->found = pSVar31;
      (result->flags).m_bits = (result->flags).m_bits | 1;
      Compilation::noteReference(pSVar36->compilation,&pSVar35->super_Symbol,false);
      goto LAB_003a9ebc;
    }
    pSVar29 = MethodPrototypeSymbol::getSubroutine((MethodPrototypeSymbol *)pSVar35);
    result->found = &pSVar29->super_Symbol;
LAB_003a9eda:
    if (pSVar29 == (SubroutineSymbol *)0x0) {
      return;
    }
  }
  pDVar30 = Symbol::getDeclaredType(&pSVar29->super_Symbol);
  pLVar15 = local_150.result;
  if (pDVar30 == (DeclaredType *)0x0) {
    return;
  }
  if ((pDVar30->field_0x3f & 0x40) == 0) {
    return;
  }
  if (bVar17) {
    if (*(char *)&((SourceRange *)((long)local_150.sourceRange + 0x10))->startLoc == '\x01') {
      pSVar31 = result->found;
      pDVar25 = Diagnostics::add(&(local_150.result)->diagnostics,(local_150.scope)->thisSym,
                                 (DiagCode)0x29000a,*(SourceRange *)local_150.sourceRange);
      Diagnostic::operator<<(pDVar25,*local_150.name);
      Diagnostic::addNote(pDVar25,(DiagCode)0x50001,pSVar31->location);
    }
    pLVar15->found = (Symbol *)0x0;
    return;
  }
  local_1b8 = pSVar35;
  LookupResult::clear(result);
  pSVar35 = local_1b8;
LAB_003a9446:
  local_1b8 = pSVar35;
  pWVar32 = pSVar36->importData;
  if (pWVar32 == (WildcardImportData *)0x0) goto LAB_003a9a04;
  local_1d0 = pWVar32;
  if ((local_1b0 & 4) != 0) {
    if (pWVar32->hasForceElaborated == false) {
      pWVar32->hasForceElaborated = true;
      Compilation::forceElaborate(local_1c0->compilation,local_1c0->thisSym);
    }
    uVar23 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        &pWVar32->importedSymbols,&local_198);
    pcVar13 = local_198._M_str;
    sVar12 = local_198._M_len;
    uVar33 = uVar23 >> ((byte)(pWVar32->importedSymbols).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                              .arrays.groups_size_index & 0x3f);
    local_1c8 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                (pWVar32->importedSymbols).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                .arrays.groups_;
    lVar38 = (uVar23 & 0xff) * 4;
    hVar53 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (&UNK_0050901c + lVar38);
    hVar56 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (&UNK_0050901d + lVar38);
    hVar57 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (&UNK_0050901e + lVar38);
    hVar58 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (&UNK_0050901f + lVar38);
    local_1a8 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                (ulong)((uint)uVar23 & 7);
    uVar24 = 0;
    hVar59 = hVar53;
    hVar61 = hVar56;
    hVar63 = hVar57;
    hVar65 = hVar58;
    hVar67 = hVar53;
    hVar69 = hVar56;
    hVar71 = hVar57;
    hVar73 = hVar58;
    hVar75 = hVar53;
    hVar77 = hVar56;
    hVar79 = hVar57;
    hVar81 = hVar58;
    do {
      phVar42 = local_1c8 + uVar33 * 0x10;
      local_58 = *phVar42;
      hStack_57 = phVar42[1];
      hStack_56 = phVar42[2];
      hStack_55 = phVar42[3];
      hStack_54 = phVar42[4];
      hStack_53 = phVar42[5];
      hStack_52 = phVar42[6];
      hStack_51 = phVar42[7];
      hStack_50 = phVar42[8];
      hStack_4f = phVar42[9];
      hStack_4e = phVar42[10];
      hStack_4d = phVar42[0xb];
      hStack_4c = phVar42[0xc];
      hStack_4b = phVar42[0xd];
      hStack_4a = phVar42[0xe];
      hStack_49 = phVar42[0xf];
      auVar48[0] = -(local_58 == hVar53);
      auVar48[1] = -(hStack_57 == hVar56);
      auVar48[2] = -(hStack_56 == hVar57);
      auVar48[3] = -(hStack_55 == hVar58);
      auVar48[4] = -(hStack_54 == hVar59);
      auVar48[5] = -(hStack_53 == hVar61);
      auVar48[6] = -(hStack_52 == hVar63);
      auVar48[7] = -(hStack_51 == hVar65);
      auVar48[8] = -(hStack_50 == hVar67);
      auVar48[9] = -(hStack_4f == hVar69);
      auVar48[10] = -(hStack_4e == hVar71);
      auVar48[0xb] = -(hStack_4d == hVar73);
      auVar48[0xc] = -(hStack_4c == hVar75);
      auVar48[0xd] = -(hStack_4b == hVar77);
      auVar48[0xe] = -(hStack_4a == hVar79);
      auVar48[0xf] = -(hStack_49 == hVar81);
      local_1b8 = (SubroutineSymbol *)CONCAT71(local_1b8._1_7_,hStack_49);
      uVar21 = (uint)(ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe);
      local_178 = uVar33;
      if (uVar21 != 0) {
        ppVar9 = (local_1d0->importedSymbols).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                 .arrays.elements_;
        local_188[1] = hVar56;
        local_188[0] = hVar53;
        local_188[2] = hVar57;
        local_188[3] = hVar58;
        local_188[4] = hVar59;
        local_188[5] = hVar61;
        local_188[6] = hVar63;
        local_188[7] = hVar65;
        local_188[8] = hVar67;
        local_188[9] = hVar69;
        local_188[10] = hVar71;
        local_188[0xb] = hVar73;
        local_188[0xc] = hVar75;
        local_188[0xd] = hVar77;
        local_188[0xe] = hVar79;
        local_188[0xf] = hVar81;
        do {
          uVar10 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar37 = (ulong)uVar10;
          if (sVar12 == ppVar9[uVar33 * 0xf + uVar37].first._M_len) {
            if (sVar12 == 0) {
LAB_003a9fe3:
              (result->flags).m_bits = (result->flags).m_bits | 1;
              result->found = ppVar9[uVar33 * 0xf + uVar37].second;
              return;
            }
            iVar20 = bcmp(pcVar13,ppVar9[uVar33 * 0xf + uVar37].first._M_str,sVar12);
            hVar53 = local_188[0];
            hVar56 = local_188[1];
            hVar57 = local_188[2];
            hVar58 = local_188[3];
            hVar59 = local_188[4];
            hVar61 = local_188[5];
            hVar63 = local_188[6];
            hVar65 = local_188[7];
            hVar67 = local_188[8];
            hVar69 = local_188[9];
            hVar71 = local_188[10];
            hVar73 = local_188[0xb];
            hVar75 = local_188[0xc];
            hVar77 = local_188[0xd];
            hVar79 = local_188[0xe];
            hVar81 = local_188[0xf];
            if (iVar20 == 0) goto LAB_003a9fe3;
          }
          uVar21 = uVar21 - 1 & uVar21;
        } while (uVar21 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(long)local_1a8] & (byte)local_1b8) == 0)
      goto LAB_003a9a04;
      uVar37 = (local_1d0->importedSymbols).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
               .arrays.groups_size_mask;
      lVar38 = local_178 + uVar24;
      uVar24 = uVar24 + 1;
      uVar33 = lVar38 + 1U & uVar37;
      if (uVar37 < uVar24) goto LAB_003a9a04;
    } while( true );
  }
  local_130.info = (Info *)0x0;
  local_130._0_8_ = local_118;
  local_120 = (Info *)0x4;
  local_c8 = &local_d8;
  local_b8._0_8_ = 0x3f;
  local_b8._8_8_ = 1;
  stack0xffffffffffffff58 = ZEXT816(0x509420);
  local_98 = (undefined1  [16])0x0;
  ppWVar40 = (pWVar32->wildcardImports).
             super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppWVar6 = (pWVar32->wildcardImports).
            super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_188._0_8_ = ppWVar6;
  pSVar35 = local_1b8;
  local_c0 = local_c8;
  if (ppWVar40 != ppWVar6) {
    do {
      this = *ppWVar40;
      if ((SymbolIndex)local_178 < (this->super_Symbol).indexInScope + 1) break;
      this_01 = WildcardImportSymbol::getPackage(this);
      if (this_01 == (PackageSymbol *)0x0) {
        (result->flags).m_bits = (result->flags).m_bits | 4;
      }
      else {
        lookupName._M_str = local_198._M_str;
        lookupName._M_len = local_198._M_len;
        local_1a0 = PackageSymbol::findForImport(this_01,lookupName);
        pSVar35 = local_1b8;
        if (local_1a0 != (Symbol *)0x0) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_1a0;
          uVar37 = SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar24 = uVar37 >> (local_b8[0] & 0x3f);
          uVar5 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar37 & 0xff];
          uVar39 = 0;
          uVar33 = uVar24;
          do {
            pgVar3 = (group_type_pointer)(local_b8._16_8_ + uVar33 * 0x10);
            local_68 = pgVar3->m[0].n;
            uStack_67 = pgVar3->m[1].n;
            uStack_66 = pgVar3->m[2].n;
            bStack_65 = pgVar3->m[3].n;
            uStack_64 = pgVar3->m[4].n;
            uStack_63 = pgVar3->m[5].n;
            uStack_62 = pgVar3->m[6].n;
            bStack_61 = pgVar3->m[7].n;
            uStack_60 = pgVar3->m[8].n;
            uStack_5f = pgVar3->m[9].n;
            uStack_5e = pgVar3->m[10].n;
            bStack_5d = pgVar3->m[0xb].n;
            uStack_5c = pgVar3->m[0xc].n;
            uStack_5b = pgVar3->m[0xd].n;
            uStack_5a = pgVar3->m[0xe].n;
            bStack_59 = pgVar3->m[0xf].n;
            uVar46 = (uchar)uVar5;
            auVar55[0] = -(local_68 == uVar46);
            uVar50 = (uchar)((uint)uVar5 >> 8);
            auVar55[1] = -(uStack_67 == uVar50);
            uVar51 = (uchar)((uint)uVar5 >> 0x10);
            auVar55[2] = -(uStack_66 == uVar51);
            bVar52 = (byte)((uint)uVar5 >> 0x18);
            auVar55[3] = -(bStack_65 == bVar52);
            auVar55[4] = -(uStack_64 == uVar46);
            auVar55[5] = -(uStack_63 == uVar50);
            auVar55[6] = -(uStack_62 == uVar51);
            auVar55[7] = -(bStack_61 == bVar52);
            auVar55[8] = -(uStack_60 == uVar46);
            auVar55[9] = -(uStack_5f == uVar50);
            auVar55[10] = -(uStack_5e == uVar51);
            auVar55[0xb] = -(bStack_5d == bVar52);
            auVar55[0xc] = -(uStack_5c == uVar46);
            auVar55[0xd] = -(uStack_5b == uVar50);
            auVar55[0xe] = -(uStack_5a == uVar51);
            auVar55[0xf] = -(bStack_59 == bVar52);
            for (uVar21 = (uint)(ushort)((ushort)(SUB161(auVar55 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe); uVar21 != 0
                ; uVar21 = uVar21 - 1 & uVar21) {
              uVar10 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              pWVar32 = local_1d0;
              if (local_1a0 == ppSStack_a0[uVar33 * 0xf + (ulong)uVar10]) goto LAB_003a9792;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar37 & 7] & bStack_59) == 0)
            break;
            lVar38 = uVar33 + uVar39;
            uVar39 = uVar39 + 1;
            uVar33 = lVar38 + 1U & local_b8._8_8_;
          } while (uVar39 <= (ulong)local_b8._8_8_);
          if ((ulong)local_98._8_8_ < (ulong)local_98._0_8_) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
            ::nosize_unchecked_emplace_at<slang::ast::Symbol_const*&>
                      ((locator *)&local_168,
                       (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
                        *)&local_c0,(arrays_type *)local_b8,uVar24,uVar37,&local_1a0);
            local_98._8_8_ = local_98._8_8_ + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
            ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*&>
                      ((locator *)&local_168,
                       (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
                        *)&local_c0,uVar37,&local_1a0);
          }
          pSVar31 = local_1a0;
          lVar38 = (long)local_130.info * 0x10;
          phVar42 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    (local_130._0_8_ + lVar38);
          if (local_130.info == local_120) {
            if (-(long)local_130.info == -0x7ffffffffffffff) {
              slang::detail::throwLengthError();
            }
            pIVar34 = (Info *)((long)&(local_130.info)->rawTextPtr + 1);
            if (pIVar34 < (Info *)((long)local_130.info * 2)) {
              pIVar34 = (Info *)((long)local_130.info * 2);
            }
            if ((Info *)(-(long)local_130.info + 0x7ffffffffffffffU) < local_130.info) {
              pIVar34 = (Info *)0x7ffffffffffffff;
            }
            __dest = operator_new((long)pIVar34 << 4);
            *(Symbol **)((long)__dest + lVar38) = pSVar31;
            *(WildcardImportSymbol **)((long)__dest + lVar38 + 8) = this;
            p = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)local_130._0_8_
            ;
            pIVar45 = local_130.info;
            __n = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                  (local_130._0_8_ + ((long)local_130.info * 0x10 - (long)phVar42));
            if (__n == (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)0x0) {
              if (local_130.info != (Info *)0x0) {
                memmove(__dest,(void *)local_130._0_8_,(long)local_130.info * 0x10);
              }
            }
            else {
              local_1c8 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          local_130._0_8_;
              if ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                  local_130._0_8_ != phVar42) {
                local_1a8 = __n;
                memmove(__dest,(void *)local_130._0_8_,(long)phVar42 - local_130._0_8_);
                __n = local_1a8;
              }
              memcpy((void *)((long)__dest + lVar38 + 0x10),phVar42,(size_t)__n);
              p = local_1c8;
            }
            if (p != local_118) {
              operator_delete(p);
              pIVar45 = local_130.info;
            }
            local_130.info = (Info *)((long)&pIVar45->rawTextPtr + 1);
            local_130._0_8_ = __dest;
            pWVar32 = local_1d0;
            pSVar35 = local_1b8;
            local_120 = pIVar34;
          }
          else {
            *(Symbol **)phVar42 = local_1a0;
            *(WildcardImportSymbol **)(phVar42 + 8) = this;
            local_130.info = (Info *)((long)&(local_130.info)->rawTextPtr + 1);
            pWVar32 = local_1d0;
            pSVar35 = local_1b8;
          }
        }
      }
LAB_003a9792:
      ppWVar40 = ppWVar40 + 1;
    } while (ppWVar40 != (pointer)local_188._0_8_);
    pSVar36 = local_1c0;
    if (local_130.info != (Info *)0x0) {
      if (local_130.info != (Info *)0x1) {
        if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
          range.endLoc = sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload
                         .super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.
                         endLoc;
          range.startLoc =
               sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
          pDVar25 = Diagnostics::add(&result->diagnostics,local_1c0->thisSym,(DiagCode)0xa,range);
          arg._M_str = local_198._M_str;
          arg._M_len = local_198._M_len;
          Diagnostic::operator<<(pDVar25,arg);
          if (local_130.info != (Info *)0x0) {
            uVar14 = local_130._0_8_;
            lVar43 = (long)local_130.info << 4;
            lVar38 = 0;
            do {
              Diagnostic::addNote(pDVar25,(DiagCode)0x3f000a,
                                  *(SourceLocation *)(*(long *)(uVar14 + 8 + lVar38) + 0x18));
              Diagnostic::addNote(pDVar25,(DiagCode)0x50001,
                                  *(SourceLocation *)(*(long *)(uVar14 + lVar38) + 0x18));
              lVar38 = lVar38 + 0x10;
            } while (lVar43 != lVar38);
          }
        }
        goto LAB_003a992f;
      }
      if ((pSVar35 != (SubroutineSymbol *)0x0) &&
         (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged == true)) {
        if ((pSVar35->super_Symbol).kind == ExplicitImport) {
          pSVar31 = ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)pSVar35);
          if (pSVar31 == *(Symbol **)local_130._0_8_) goto LAB_003aa0d8;
        }
        range_01.endLoc =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
        range_01.startLoc =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
        pDVar25 = Diagnostics::add(&result->diagnostics,pSVar36->thisSym,(DiagCode)0x10000a,range_01
                                  );
        arg_00._M_str = local_198._M_str;
        arg_00._M_len = local_198._M_len;
        Diagnostic::operator<<(pDVar25,arg_00);
        Diagnostic::addNote(pDVar25,(DiagCode)0x50001,(pSVar35->super_Symbol).location);
        Diagnostic::addNote(pDVar25,(DiagCode)0x3f000a,
                            *(SourceLocation *)(*(long *)(local_130._0_8_ + 8) + 0x18));
        Diagnostic::addNote(pDVar25,(DiagCode)0x50001,
                            *(SourceLocation *)(*(long *)local_130._0_8_ + 0x18));
      }
LAB_003aa0d8:
      (result->flags).m_bits = (result->flags).m_bits | 1;
      result->found = *(Symbol **)local_130._0_8_;
      Compilation::noteReference(pSVar36->compilation,*(Symbol **)(local_130._0_8_ + 8),false);
      sv = &result->found->name;
      local_188._0_8_ = &pWVar32->importedSymbols;
      uVar33 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          &pWVar32->importedSymbols,sv);
      pSVar41 = (Scope *)(uVar33 >>
                         ((byte)(pWVar32->importedSymbols).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                                .arrays.groups_size_index & 0x3f));
      lVar38 = (uVar33 & 0xff) * 4;
      uVar46 = (&UNK_0050901c)[lVar38];
      uVar50 = (&UNK_0050901d)[lVar38];
      uVar51 = (&UNK_0050901e)[lVar38];
      bVar52 = (&UNK_0050901f)[lVar38];
      phVar42 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                (ulong)((uint)uVar33 & 7);
      pSVar35 = (SubroutineSymbol *)0x0;
      uVar14 = local_188._0_8_;
      pSVar36 = pSVar41;
      uVar60 = uVar46;
      uVar62 = uVar50;
      uVar64 = uVar51;
      bVar66 = bVar52;
      uVar68 = uVar46;
      uVar70 = uVar50;
      uVar72 = uVar51;
      bVar74 = bVar52;
      uVar76 = uVar46;
      uVar78 = uVar50;
      uVar80 = uVar51;
      bVar82 = bVar52;
      do {
        pgVar8 = (pWVar32->importedSymbols).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                 .arrays.groups_;
        pgVar4 = pgVar8 + (long)pSVar36;
        local_78 = pgVar4->m[0].n;
        uStack_77 = pgVar4->m[1].n;
        uStack_76 = pgVar4->m[2].n;
        bStack_75 = pgVar4->m[3].n;
        uStack_74 = pgVar4->m[4].n;
        uStack_73 = pgVar4->m[5].n;
        uStack_72 = pgVar4->m[6].n;
        bStack_71 = pgVar4->m[7].n;
        uStack_70 = pgVar4->m[8].n;
        uStack_6f = pgVar4->m[9].n;
        uStack_6e = pgVar4->m[10].n;
        bStack_6d = pgVar4->m[0xb].n;
        uStack_6c = pgVar4->m[0xc].n;
        uStack_6b = pgVar4->m[0xd].n;
        uStack_6a = pgVar4->m[0xe].n;
        bVar18 = pgVar4->m[0xf].n;
        auVar49[0] = -(local_78 == uVar46);
        auVar49[1] = -(uStack_77 == uVar50);
        auVar49[2] = -(uStack_76 == uVar51);
        auVar49[3] = -(bStack_75 == bVar52);
        auVar49[4] = -(uStack_74 == uVar60);
        auVar49[5] = -(uStack_73 == uVar62);
        auVar49[6] = -(uStack_72 == uVar64);
        auVar49[7] = -(bStack_71 == bVar66);
        auVar49[8] = -(uStack_70 == uVar68);
        auVar49[9] = -(uStack_6f == uVar70);
        auVar49[10] = -(uStack_6e == uVar72);
        auVar49[0xb] = -(bStack_6d == bVar74);
        auVar49[0xc] = -(uStack_6c == uVar76);
        auVar49[0xd] = -(uStack_6b == uVar78);
        auVar49[0xe] = -(uStack_6a == uVar80);
        auVar49[0xf] = -(bVar18 == bVar82);
        uVar21 = (uint)(ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe);
        bStack_69 = bVar18;
        if (uVar21 != 0) {
          local_178._0_4_ = CONCAT13(bVar52,CONCAT12(uVar51,CONCAT11(uVar50,uVar46)));
          local_178 = CONCAT17(bVar66,CONCAT16(uVar64,CONCAT15(uVar62,CONCAT14(uVar60,(SymbolIndex)
                                                                                      local_178))));
          ppVar9 = (pWVar32->importedSymbols).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                   .arrays.elements_;
          local_1c8 = phVar42;
          local_1c0 = pSVar36;
          local_1b8 = pSVar35;
          local_1b0 = uVar33;
          uStack_170 = uVar68;
          uStack_16f = uVar70;
          uStack_16e = uVar72;
          bStack_16d = bVar74;
          uStack_16c = uVar76;
          uStack_16b = uVar78;
          uStack_16a = uVar80;
          bStack_169 = bVar82;
          do {
            uVar10 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
              }
            }
            bVar17 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                     operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                                uVar14,sv,&ppVar9[(long)pSVar36 * 0xf + (ulong)uVar10].first);
            if (bVar17) goto LAB_003a992f;
            uVar21 = uVar21 - 1 & uVar21;
          } while (uVar21 != 0);
          bVar18 = pgVar8[(long)pSVar36].m[0xf].n;
          pSVar35 = local_1b8;
          pSVar36 = local_1c0;
          uVar33 = local_1b0;
          phVar42 = local_1c8;
          uVar46 = (uchar)local_178;
          uVar50 = local_178._1_1_;
          uVar51 = local_178._2_1_;
          bVar52 = local_178._3_1_;
          uVar60 = local_178._4_1_;
          uVar62 = local_178._5_1_;
          uVar64 = local_178._6_1_;
          bVar66 = local_178._7_1_;
          uVar68 = uStack_170;
          uVar70 = uStack_16f;
          uVar72 = uStack_16e;
          bVar74 = bStack_16d;
          uVar76 = uStack_16c;
          uVar78 = uStack_16b;
          uVar80 = uStack_16a;
          bVar82 = bStack_169;
        }
        pWVar32 = local_1d0;
        if (((byte)phVar42[0x509410] & bVar18) == 0) break;
        pSVar29 = (SubroutineSymbol *)
                  (local_1d0->importedSymbols).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                  .arrays.groups_size_mask;
        pSVar31 = &pSVar35->super_Symbol;
        pSVar35 = (SubroutineSymbol *)((long)&(pSVar35->super_Symbol).kind + 1);
        pSVar36 = (Scope *)((ulong)((long)&pSVar36->compilation + (long)((long)&pSVar31->kind + 1))
                           & (ulong)pSVar29);
      } while (pSVar35 <= pSVar29);
      if ((local_1d0->importedSymbols).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
          .size_ctrl.size <
          (local_1d0->importedSymbols).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
                  (&local_168,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                    *)local_188._0_8_,(arrays_type *)local_188._0_8_,(size_t)pSVar41,uVar33,
                   &local_1d1,sv,&result->found);
        psVar1 = &(pWVar32->importedSymbols).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
                  (&local_168,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                    *)local_188._0_8_,uVar33,&local_1d1,sv,&result->found);
      }
LAB_003a992f:
      local_168.pg = local_c0;
      if (ppSStack_a0 != (Symbol **)0x0) {
        slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>::deallocate
                  ((StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL> *)&local_168,ppSStack_a0,
                   local_b8._8_8_ * 0x88 + 0x96U >> 3);
      }
      if ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)local_130._0_8_ ==
          local_118) {
        return;
      }
      operator_delete((void *)local_130._0_8_);
      return;
    }
  }
  local_168.pg = local_c0;
  if (ppSStack_a0 != (Symbol **)0x0) {
    slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>::deallocate
              ((StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL> *)&local_168,ppSStack_a0,
               local_b8._8_8_ * 0x88 + 0x96U >> 3);
  }
  if ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)local_130._0_8_ !=
      local_118) {
    operator_delete((void *)local_130._0_8_);
  }
LAB_003a9a04:
  pSVar31 = local_1c0->thisSym;
  pSVar36 = pSVar31->parentScope;
  if (pSVar36 != (Scope *)0x0) {
    SVar44 = pSVar31->indexInScope + 1;
    SVar22 = pSVar31->kind;
    if (SVar22 == ConstraintBlock) {
      outOfBlockIndex_00 = *(SymbolIndex *)&pSVar31[2].name._M_str;
    }
    else if (SVar22 == Subroutine) {
      outOfBlockIndex_00 = (SymbolIndex)pSVar31[3].name._M_len;
    }
    else {
      if (outOfBlockIndex != 0) {
        SVar44 = outOfBlockIndex;
      }
      outOfBlockIndex_00 = 0;
      if (SVar22 == ClassType) {
        if (pSVar31[1].indexInScope != 0) {
          Scope::elaborate((Scope *)&pSVar31[1].name);
        }
        SVar28 = pSVar31[2].location;
        if (SVar28 != (SourceLocation)0x0) {
          pTVar27 = *(Type **)((long)SVar28 + 0x40);
          if (pTVar27 == (Type *)0x0) {
            Type::resolveCanonical((Type *)SVar28);
            pTVar27 = *(Type **)((long)SVar28 + 0x40);
          }
          if ((pTVar27->super_Symbol).kind == ErrorType) {
            (result->flags).m_bits = (result->flags).m_bits | 4;
          }
        }
      }
    }
    if (((local_1b0._0_4_ >> 0xe & 1) == 0) || (pSVar36->thisSym->kind != CompilationUnit)) {
      name_00._M_str = local_198._M_str;
      name_00._M_len = local_198._M_len;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._17_7_;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_engaged;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
      location_00.index = SVar44;
      location_00.scope = (Scope *)&sourceRange;
      location_00._12_4_ = 0;
      unqualifiedImpl(pSVar36,name_00,location_00,sourceRange_00,local_1b0._0_4_,outOfBlockIndex_00,
                      result,originalScope,originalSyntax);
    }
  }
  return;
}

Assistant:

void Lookup::unqualifiedImpl(const Scope& scope, std::string_view name, LookupLocation location,
                             std::optional<SourceRange> sourceRange, bitmask<LookupFlags> flags,
                             SymbolIndex outOfBlockIndex, LookupResult& result,
                             const Scope& originalScope, const SyntaxNode* originalSyntax) {
    auto reportRecursiveError = [&](const Symbol& symbol) {
        if (sourceRange) {
            auto& diag = result.addDiag(scope, diag::RecursiveDefinition, *sourceRange);
            diag << name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
        }
        result.found = nullptr;
    };

    // Try a simple name lookup to see if we find anything.
    auto& nameMap = scope.getNameMap();
    const Symbol* symbol = nullptr;
    if (auto it = nameMap.find(name); it != nameMap.end()) {
        // If the lookup is for a local name, check that we can access the symbol (it must be
        // declared before use). Callables and block names can be referenced anywhere in the
        // scope, so the location doesn't matter for them.
        symbol = it->second;
        bool locationGood = LookupLocation::before(*symbol) < location;
        if (!locationGood) {
            // A type alias can have forward definitions, so check those locations as well.
            // The forward decls form a linked list that are always ordered by location,
            // so we only need to check the first one.
            const ForwardingTypedefSymbol* forward = nullptr;
            switch (symbol->kind) {
                case SymbolKind::TypeAlias:
                    forward = symbol->as<TypeAliasType>().getFirstForwardDecl();
                    break;
                case SymbolKind::ClassType:
                    forward = symbol->as<ClassType>().getFirstForwardDecl();
                    break;
                case SymbolKind::GenericClassDef:
                    forward = symbol->as<GenericClassDefSymbol>().getFirstForwardDecl();
                    break;
                case SymbolKind::Subroutine: {
                    // Subroutines can be referenced before they are declared if they
                    // are tasks or return void (tasks are always set to have a void
                    // return type internally so we only need one check here).
                    //
                    // It's important to check that we're not in the middle of evaluating
                    // the return type before we try to access that return type or
                    // we'll hard fail.
                    auto& sub = symbol->as<SubroutineSymbol>();
                    if (sub.declaredReturnType.isEvaluating()) {
                        reportRecursiveError(*symbol);
                        return;
                    }

                    // Also allow built-ins to always be found; they don't really
                    // have a location since they're intrinsically defined.
                    locationGood = sub.getReturnType().isVoid() ||
                                   sub.flags.has(MethodFlags::BuiltIn);
                    break;
                }
                case SymbolKind::MethodPrototype: {
                    // Same as above.
                    auto& sub = symbol->as<MethodPrototypeSymbol>();
                    if (sub.declaredReturnType.isEvaluating()) {
                        reportRecursiveError(*symbol);
                        return;
                    }

                    locationGood = sub.getReturnType().isVoid() ||
                                   sub.flags.has(MethodFlags::BuiltIn);
                    break;
                }
                case SymbolKind::Sequence:
                case SymbolKind::Property:
                    // Sequences and properties can always be referenced before declaration.
                    locationGood = true;
                    break;
                case SymbolKind::Parameter:
                case SymbolKind::Specparam:
                case SymbolKind::EnumValue:
                    // Constants can never be looked up before their declaration,
                    // to avoid problems with recursive constant evaluation.
                    flags &= ~LookupFlags::AllowDeclaredAfter;
                    break;
                default:
                    break;
            }

            if (forward) {
                locationGood = LookupLocation::before(*forward) < location;
                result.flags |= LookupResultFlags::FromForwardTypedef;
            }
        }
        else if (symbol->kind == SymbolKind::TransparentMember && originalSyntax) {
            // Enum values are special in that we can't always get a precise ordering
            // of where they are declared in a scope, since they can be declared inside
            // a nested subexpression. Check for correct location by looking at the
            // actual source locations involved.
            auto& wrapped = symbol->as<TransparentMemberSymbol>().wrapped;
            if (wrapped.kind == SymbolKind::EnumValue) {
                // If the enum was inherited from a base class then we shouldn't
                // worry about the source location; the base class may be declared
                // later in the file.
                bool skipLocationCheck = false;
                auto enumScope = wrapped.getParentScope()->asSymbol().getParentScope();
                SLANG_ASSERT(enumScope);
                if (enumScope->asSymbol().kind == SymbolKind::ClassType) {
                    auto containingClass = getContainingClass(scope).first;
                    if (containingClass &&
                        containingClass->isDerivedFrom(enumScope->asSymbol().as<ClassType>())) {
                        skipLocationCheck = true;
                    }
                }

                if (auto sm = scope.getCompilation().getSourceManager(); sm && !skipLocationCheck) {
                    auto loc = originalSyntax->getFirstToken().location();
                    locationGood =
                        sm->isBeforeInCompilationUnit(wrapped.location, loc).value_or(true);
                }
            }
        }

        if (locationGood || flags.has(LookupFlags::AllowDeclaredAfter)) {
            // Unwrap the symbol if it's hidden behind an import or hoisted enum member.
            if (symbol->kind == SymbolKind::TransparentMember) {
                do {
                    symbol = &symbol->as<TransparentMemberSymbol>().wrapped;
                } while (symbol->kind == SymbolKind::TransparentMember);

                // Special case check for a lookup finding hoisted members of an anonymous
                // program. For these we need to verify that the original lookup location is
                // also in a program.
                if (symbol->getParentScope()->asSymbol().kind == SymbolKind::AnonymousProgram &&
                    !isInProgram(originalScope.asSymbol()) && sourceRange) {
                    auto& diag = result.addDiag(scope, diag::IllegalReferenceToProgramItem,
                                                *sourceRange);
                    diag.addNote(diag::NoteDeclarationHere, symbol->location);
                }
            }

            switch (symbol->kind) {
                case SymbolKind::ExplicitImport:
                    result.found = symbol->as<ExplicitImportSymbol>().importedSymbol();
                    result.flags |= LookupResultFlags::WasImported;
                    scope.getCompilation().noteReference(*symbol);
                    break;
                case SymbolKind::ForwardingTypedef:
                    // If we find a forwarding typedef, the actual typedef was never defined.
                    // Just ignore it, we'll issue a better error later.
                    break;
                case SymbolKind::MethodPrototype:
                    // Looking up a prototype should always forward on to the actual method.
                    result.found = symbol->as<MethodPrototypeSymbol>().getSubroutine();
                    break;
                case SymbolKind::ModportClocking:
                    result.found = symbol->as<ModportClockingSymbol>().target;
                    break;
                default:
                    result.found = symbol;
                    break;
            }

            // We have a fully resolved and valid symbol. Before we return back to the caller,
            // make sure that the symbol we're returning isn't in the process of having its type
            // evaluated. This can only happen with a mutually recursive definition of something
            // like a parameter and a function, so detect and report the error here to avoid a
            // stack overflow.
            bool done = true;
            if (result.found) {
                auto declaredType = result.found->getDeclaredType();
                if (declaredType && declaredType->isEvaluating()) {
                    if (locationGood) {
                        reportRecursiveError(*result.found);
                    }
                    else {
                        // We overrode the location checking via a flag and
                        // it's probably biting us now by causing us to find
                        // our own symbol when we otherwise shouldn't.
                        // Work around this by just pretending we didn't find anything.
                        done = false;
                        result.clear();
                    }
                }
            }

            if (done)
                return;
        }
    }

    // Look through any wildcard imports prior to the lookup point and see if their packages
    // contain the name we're looking for.
    if (auto wildcardImportData = scope.getWildcardImportData()) {
        if (flags.has(LookupFlags::DisallowWildcardImport)) {
            // We're in a context that disallows new imports via wildcard imports,
            // but we can still reference any symbols that were previously imported
            // that way from some other lookup. In order to be sure we've seen all of
            // those lookups we need to force elaborate the scope first.
            if (!wildcardImportData->hasForceElaborated) {
                wildcardImportData->hasForceElaborated = true;
                scope.getCompilation().forceElaborate(scope.asSymbol());
            }

            if (auto it = wildcardImportData->importedSymbols.find(name);
                it != wildcardImportData->importedSymbols.end()) {
                result.flags |= LookupResultFlags::WasImported;
                result.found = it->second;
                return;
            }
        }
        else {
            struct Import {
                const Symbol* imported;
                const WildcardImportSymbol* import;
            };
            SmallVector<Import, 4> imports;
            SmallSet<const Symbol*, 2> importDedup;

            for (auto import : wildcardImportData->wildcardImports) {
                if (location < LookupLocation::after(*import))
                    break;

                auto package = import->getPackage();
                if (!package) {
                    result.flags |= LookupResultFlags::SuppressUndeclared;
                    continue;
                }

                const Symbol* imported = package->findForImport(name);
                if (imported && importDedup.emplace(imported).second)
                    imports.emplace_back(Import{imported, import});
            }

            if (!imports.empty()) {
                if (imports.size() > 1) {
                    if (sourceRange) {
                        auto& diag = result.addDiag(scope, diag::AmbiguousWildcardImport,
                                                    *sourceRange);
                        diag << name;
                        for (const auto& pair : imports) {
                            diag.addNote(diag::NoteImportedFrom, pair.import->location);
                            diag.addNote(diag::NoteDeclarationHere, pair.imported->location);
                        }
                    }
                    return;
                }

                if (symbol && sourceRange) {
                    // The existing symbol might be an import for the thing we just imported
                    // via wildcard, which is fine so don't error for that case.
                    if (symbol->kind != SymbolKind::ExplicitImport ||
                        symbol->as<ExplicitImportSymbol>().importedSymbol() !=
                            imports[0].imported) {

                        auto& diag = result.addDiag(scope, diag::ImportNameCollision, *sourceRange);
                        diag << name;
                        diag.addNote(diag::NoteDeclarationHere, symbol->location);
                        diag.addNote(diag::NoteImportedFrom, imports[0].import->location);
                        diag.addNote(diag::NoteDeclarationHere, imports[0].imported->location);
                    }
                }

                result.flags |= LookupResultFlags::WasImported;
                result.found = imports[0].imported;
                scope.getCompilation().noteReference(*imports[0].import);

                wildcardImportData->importedSymbols.try_emplace(result.found->name, result.found);
                return;
            }
        }
    }

    // Continue up the scope chain via our parent.
    location = LookupLocation::after(scope.asSymbol());
    if (!location.getScope())
        return;

    // If this scope was an out-of-block subroutine, tell the next recursive call about it.
    // Otherwise, if our previous call was for such a situation and we didn't find the symbol
    // in this class scope, we need to use the subroutine's out-of-block lookup location
    // instead in order to properly handle cases like:
    //   class C;
    //     extern function int foo;
    //   endclass
    //   localparam int k = ...;
    //   function int C::foo;
    //     return k;
    //   endfunction
    auto& sym = scope.asSymbol();
    if (sym.kind == SymbolKind::Subroutine) {
        outOfBlockIndex = sym.as<SubroutineSymbol>().outOfBlockIndex;
    }
    else if (sym.kind == SymbolKind::ConstraintBlock) {
        outOfBlockIndex = sym.as<ConstraintBlockSymbol>().getOutOfBlockIndex();
    }
    else if (uint32_t(outOfBlockIndex) != 0) {
        location = LookupLocation(location.getScope(), uint32_t(outOfBlockIndex));
        outOfBlockIndex = SymbolIndex(0);
    }

    if (sym.kind == SymbolKind::ClassType) {
        // Suppress errors when we fail to find a symbol inside a class that
        // had a problem resolving its base class, since the symbol may be
        // expected to be defined in the base.
        auto baseClass = sym.as<ClassType>().getBaseClass();
        if (baseClass && baseClass->isError())
            result.flags |= LookupResultFlags::SuppressUndeclared;
    }

    if (flags.has(LookupFlags::DisallowUnitReferences) &&
        location.getScope()->asSymbol().kind == SymbolKind::CompilationUnit) {
        return;
    }

    return unqualifiedImpl(*location.getScope(), name, location, sourceRange, flags,
                           outOfBlockIndex, result, originalScope, originalSyntax);
}